

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

Interaction * __thiscall phyr::Sphere::sample(Sphere *this,Interaction *ref,Point2f *u,double *pdf)

{
  uint uVar1;
  double *pdVar2;
  Point2<double> *in_RCX;
  Vector3<double> *in_RDX;
  Vector3<double> *in_RSI;
  Interaction *in_RDI;
  double *in_R8;
  double dVar3;
  double dVar4;
  Interaction *this_00;
  Point3<double> *p2;
  double extraout_XMM0_Qa;
  Interaction *intr;
  Point3f pWorld;
  Vector3f nWorld;
  double sinAlpha;
  double cosAlpha;
  double ds;
  double dc;
  double phi;
  double sinTheta;
  double cosTheta;
  double cosThetaMax;
  double sinThetaMax2;
  Vector3f wcY;
  Vector3f wcX;
  Vector3f wc;
  Vector3f wi;
  Point3f pOrigin;
  Point3f pCenter;
  Vector3<double> *in_stack_fffffffffffffcb8;
  Normal3<double> *in_stack_fffffffffffffcc0;
  Point3<double> *in_stack_fffffffffffffcc8;
  Point3<double> *in_stack_fffffffffffffcd0;
  Vector3<double> *v;
  Point3<double> *in_stack_fffffffffffffd08;
  Transform *in_stack_fffffffffffffd10;
  Vector3f *z;
  Vector3<double> *v2;
  Vector3f *in_stack_fffffffffffffd48;
  Vector3f *in_stack_fffffffffffffd50;
  Normal3f *in_stack_fffffffffffffd58;
  Point3f *in_stack_fffffffffffffd60;
  double local_270;
  double local_268;
  double local_260;
  Point3<double> local_258 [2];
  Point3<double> local_228 [4];
  Vector3<double> local_1c8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  Vector3<double> *local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  Vector3<double> local_128;
  Vector3<double> local_110 [4];
  double local_b0;
  double local_a8;
  double local_a0;
  Vector3<double> local_98 [3];
  Point3<double> local_50 [2];
  double *local_20;
  Point2<double> *local_18;
  Vector3<double> *local_10;
  
  z = (Vector3f *)in_RSI->y;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  Point3<double>::Point3(local_50,0.0,0.0,0.0);
  Transform::operator()(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  v2 = local_10 + 1;
  Point3<double>::operator-
            ((Point3<double> *)in_stack_fffffffffffffcc0,(Point3<double> *)in_stack_fffffffffffffcb8
            );
  offsetRayOrigin(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                  in_stack_fffffffffffffd48);
  dVar3 = distanceSquared<double>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (in_RSI[1].y * in_RSI[1].y < dVar3) {
    Point3<double>::operator-
              ((Point3<double> *)in_stack_fffffffffffffcc0,
               (Point3<double> *)in_stack_fffffffffffffcb8);
    normalize<double>((Vector3<double> *)in_stack_fffffffffffffcd0);
    Vector3<double>::Vector3(local_110);
    Vector3<double>::Vector3(&local_128);
    coordinateSystem<double>(in_RSI,v2,local_10);
    this_00 = (Interaction *)(in_RSI[1].y * in_RSI[1].y);
    local_130 = distanceSquared<double>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_130 = (double)this_00 / local_130;
    local_140 = 0.0;
    local_148 = 1.0 - local_130;
    pdVar2 = std::max<double>(&local_140,&local_148);
    local_138 = sqrt(*pdVar2);
    dVar3 = Point2<double>::operator[](local_18,0);
    p2 = (Point3<double> *)(1.0 - dVar3);
    dVar3 = Point2<double>::operator[](local_18,0);
    local_150 = (Vector3<double> *)(dVar3 * local_138 + (double)p2);
    local_160 = 0.0;
    local_168 = -(double)local_150 * (double)local_150 + 1.0;
    pdVar2 = std::max<double>(&local_160,&local_168);
    local_158 = sqrt(*pdVar2);
    dVar3 = Point2<double>::operator[](local_18,1);
    local_170 = dVar3 * 2.0 * 3.141592653589793;
    dVar3 = distance<double>(in_stack_fffffffffffffcd0,p2);
    local_188 = 0.0;
    local_190 = in_RSI[1].y * in_RSI[1].y + -(dVar3 * dVar3 * local_158 * local_158);
    v = local_150;
    local_178 = dVar3;
    pdVar2 = std::max<double>(&local_188,&local_190);
    dVar4 = sqrt(*pdVar2);
    local_180 = dVar3 * (double)v + -dVar4;
    local_198 = (-local_180 * local_180 + local_178 * local_178 + in_RSI[1].y * in_RSI[1].y) /
                (local_178 * 2.0 * in_RSI[1].y);
    local_1a8 = 0.0;
    local_1b0 = -local_198 * local_198 + 1.0;
    pdVar2 = std::max<double>(&local_1a8,&local_1b0);
    local_1a0 = sqrt(*pdVar2);
    Vector3<double>::operator-((Vector3<double> *)this_00);
    Vector3<double>::operator-((Vector3<double> *)this_00);
    Vector3<double>::operator-((Vector3<double> *)this_00);
    sphericalDirection((double)in_stack_fffffffffffffd50,(double)in_stack_fffffffffffffd48,
                       (double)in_RSI,v2,local_10,z);
    Point3<double>::Point3(local_258,local_1c8.x,local_1c8.y,local_1c8.z);
    phyr::operator*((double)this_00,(Point3<double> *)in_stack_fffffffffffffcb8);
    Point3<double>::operator+(&this_00->p,(Point3<double> *)in_stack_fffffffffffffcb8);
    Interaction::Interaction(this_00);
    (in_RDI->p).x = local_228[0].x;
    (in_RDI->p).y = local_228[0].y;
    (in_RDI->p).z = local_228[0].z;
    gamma(extraout_XMM0_Qa);
    Vector3<double>::Vector3((Vector3<double> *)&stack0xfffffffffffffd60,local_228);
    abs<double>(v);
    phyr::operator*((double)this_00,in_stack_fffffffffffffcb8);
    (in_RDI->pfError).x = local_270;
    (in_RDI->pfError).y = local_268;
    (in_RDI->pfError).z = local_260;
    Normal3<double>::Normal3((Normal3<double> *)&stack0xfffffffffffffd48,&local_1c8);
    (in_RDI->n).x = (double)in_stack_fffffffffffffd48;
    (in_RDI->n).y = (double)in_stack_fffffffffffffd50;
    (in_RDI->n).z = (double)in_stack_fffffffffffffd58;
    if (((ulong)in_RSI[1].x & 1) != 0) {
      Normal3<double>::operator*=(&in_RDI->n,-1);
    }
    *local_20 = 1.0 / ((1.0 - local_138) * 6.283185307179586);
  }
  else {
    (**(code **)((long)in_RSI->x + 0x38))(in_RDI,in_RSI,local_18,local_20);
    Point3<double>::operator-
              ((Point3<double> *)in_stack_fffffffffffffcc0,
               (Point3<double> *)in_stack_fffffffffffffcb8);
    dVar3 = Vector3<double>::lengthSquared(local_98);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      normalize<double>((Vector3<double> *)in_stack_fffffffffffffcd0);
      local_98[0].x = local_b0;
      local_98[0].y = local_a8;
      local_98[0].z = local_a0;
      dVar3 = distanceSquared<double>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      Vector3<double>::operator-((Vector3<double> *)in_stack_fffffffffffffcc0);
      dVar4 = absDot<double>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      *local_20 = (dVar3 / dVar4) * *local_20;
    }
    else {
      *local_20 = 0.0;
    }
    uVar1 = std::isinf(*local_20);
    if ((uVar1 & 1) != 0) {
      *local_20 = 0.0;
    }
  }
  return in_RDI;
}

Assistant:

Interaction Sphere::sample(const Interaction& ref, const Point2f& u,
                           Real* pdf) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));

    // Sample uniformly on sphere if $\pt{}$ is inside it
    Point3f pOrigin = offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);

    if (distanceSquared(pOrigin, pCenter) <= radius * radius) {
        Interaction intr = sample(u, pdf);
        Vector3f wi = intr.p - ref.p;
        if (wi.lengthSquared() == 0) {
            *pdf = 0;
        } else {
            // Convert from area measure returned by Sample() call above to
            // solid angle measure.
            wi = normalize(wi);
            *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        }

        if (std::isinf(*pdf)) *pdf = 0.f;
        return intr;
    }

    // Compute coordinate system for sphere sampling
    Vector3f wc = normalize(pCenter - ref.p);
    Vector3f wcX, wcY;
    coordinateSystem(wc, &wcX, &wcY);

    // Sample sphere uniformly inside subtended cone

    // Compute $\theta$ and $\phi$ values for sample in cone
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    Real cosTheta = (1 - u[0]) + u[0] * cosThetaMax;
    Real sinTheta = std::sqrt(std::max((Real)0, 1 - cosTheta * cosTheta));
    Real phi = u[1] * 2 * Pi;

    // Compute angle $\alpha$ from center of sphere to sampled point on surface
    Real dc = distance(ref.p, pCenter);
    Real ds = dc * cosTheta -
               std::sqrt(std::max(
                   (Real)0, radius * radius - dc * dc * sinTheta * sinTheta));
    Real cosAlpha = (dc * dc + radius * radius - ds * ds) / (2 * dc * radius);
    Real sinAlpha = std::sqrt(std::max((Real)0, 1 - cosAlpha * cosAlpha));

    // Compute surface normal and sampled point on sphere
    Vector3f nWorld = sphericalDirection(sinAlpha, cosAlpha, phi, -wcX, -wcY, -wc);
    Point3f pWorld = pCenter + radius * Point3f(nWorld.x, nWorld.y, nWorld.z);

    // Return _Interaction_ for sampled point on sphere
    Interaction it; it.p = pWorld;
    it.pfError = gamma(5) * abs((Vector3f)pWorld);
    it.n = Normal3f(nWorld);
    if (reverseNormals) it.n *= -1;

    // Uniform cone PDF.
    *pdf = 1 / (2 * Pi * (1 - cosThetaMax));

    return it;
}